

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::GetPrototypeForLazyMessage
          (ExtensionSet *this,MessageLite *extendee,int number)

{
  bool bVar1;
  bool was_packed_on_wire;
  GeneratedExtensionFinder finder;
  ExtensionInfo extension_info;
  bool local_41;
  GeneratedExtensionFinder local_40;
  ExtensionInfo local_38;
  
  local_41 = false;
  local_38.descriptor = (FieldDescriptor *)0x0;
  local_38.lazy_eager_verify_func = (LazyEagerVerifyFnType)0x0;
  local_38.field_6.enum_validity_check.func = (EnumValidityFuncWithArg *)0x0;
  local_38.field_6.enum_validity_check.arg = (void *)0x0;
  local_38.message = (MessageLite *)0x0;
  local_38.number = 0;
  local_38.type = '\0';
  local_38.is_repeated = false;
  local_38.is_packed = false;
  local_38.is_lazy = kUndefined;
  local_40.extendee_ = extendee;
  bVar1 = FindExtensionInfoFromFieldNumber<google::protobuf::internal::GeneratedExtensionFinder>
                    (this,2,number,&local_40,&local_38,&local_41);
  if (!bVar1) {
    local_38.field_6.enum_validity_check.func = (EnumValidityFuncWithArg *)(MessageLite *)0x0;
  }
  return (MessageLite *)local_38.field_6.enum_validity_check.func;
}

Assistant:

const MessageLite* ExtensionSet::GetPrototypeForLazyMessage(
    const MessageLite* extendee, int number) const {
  GeneratedExtensionFinder finder(extendee);
  bool was_packed_on_wire = false;
  ExtensionInfo extension_info;
  if (!FindExtensionInfoFromFieldNumber(
          WireFormatLite::WireType::WIRETYPE_LENGTH_DELIMITED, number, &finder,
          &extension_info, &was_packed_on_wire)) {
    return nullptr;
  }
  return extension_info.message_info.prototype;
}